

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall AGSMock::MockEngine::free_all(MockEngine *this)

{
  void *pvVar1;
  bool bVar2;
  unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
  *puVar3;
  size_type sVar4;
  ostream *poVar5;
  reference ppVar6;
  mapped_type *ppvVar7;
  reference ppVar8;
  pair<const_int,_void_*> *object_3;
  iterator __end2_1;
  iterator __begin2_1;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *__range2_1;
  pair<void_*const,_AGSMock::MockEngine::Data::Resource> *object_2;
  iterator __end2;
  iterator __begin2;
  unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
  *__range2;
  pair<const_int,_void_*> *object_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *__range1_1;
  pair<void_*const,_AGSMock::MockEngine::Data::Resource> *object;
  iterator __end1;
  iterator __begin1;
  unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
  *__range1;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> object_list;
  MockEngine *this_local;
  
  object_list._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::map
            ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             &__range1);
  puVar3 = &this->data_->objects;
  __end1 = std::
           unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
           ::begin(puVar3);
  object = (pair<void_*const,_AGSMock::MockEngine::Data::Resource> *)
           std::
           unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
           ::end(puVar3);
  while (bVar2 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>
                            ,(_Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>
                              *)&object), bVar2) {
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false,_false>
             ::operator*(&__end1);
    pvVar1 = ppVar6->first;
    ppvVar7 = std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
              ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                            *)&__range1,&(ppVar6->second).key);
    *ppvVar7 = pvVar1;
    std::__detail::
    _Node_iterator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false,_false>::
    operator++(&__end1);
  }
  __end1_1 = std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
             begin((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&__range1);
  object_1 = (pair<const_int,_void_*> *)
             std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
             end((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *
                 )&__range1);
  while (bVar2 = std::operator!=(&__end1_1,(_Self *)&object_1), bVar2) {
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_int,_void_*>_>::operator*(&__end1_1);
    free(this,ppVar8->second);
    std::_Rb_tree_iterator<std::pair<const_int,_void_*>_>::operator++(&__end1_1);
  }
  sVar4 = std::
          unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
          ::size(&this->data_->objects);
  if (sVar4 != 0) {
    poVar5 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"Warning: some resource persisted disposal.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::clear
              ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
               &__range1);
    puVar3 = &this->data_->objects;
    __end2 = std::
             unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
             ::begin(puVar3);
    object_2 = (pair<void_*const,_AGSMock::MockEngine::Data::Resource> *)
               std::
               unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
               ::end(puVar3);
    while (bVar2 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>
                              ,(_Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>
                                *)&object_2), bVar2) {
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false,_false>
               ::operator*(&__end2);
      pvVar1 = ppVar6->first;
      ppvVar7 = std::
                map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
                operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                            *)&__range1,&(ppVar6->second).key);
      *ppvVar7 = pvVar1;
      std::__detail::
      _Node_iterator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false,_false>::
      operator++(&__end2);
    }
    __end2_1 = std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               ::begin((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                        *)&__range1);
    object_3 = (pair<const_int,_void_*> *)
               std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               ::end((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                      *)&__range1);
    while (bVar2 = std::operator!=(&__end2_1,(_Self *)&object_3), bVar2) {
      ppVar8 = std::_Rb_tree_iterator<std::pair<const_int,_void_*>_>::operator*(&__end2_1);
      free(this,ppVar8->second);
      std::_Rb_tree_iterator<std::pair<const_int,_void_*>_>::operator++(&__end2_1);
    }
  }
  std::
  unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
  ::clear(&this->data_->objects);
  std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::~map
            ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             &__range1);
  return;
}

Assistant:

void MockEngine::free_all()
{
	map<int, void *> object_list;
	for (auto &object : data_->objects)
		object_list[object.second.key] = object.first;

	for (auto &object : object_list)
		free(object.second);

	if (data_->objects.size() > 0)
	{
		using namespace std;
		cout << endl << "Warning: some resource persisted disposal." << endl;

		object_list.clear();
		for (auto &object : data_->objects)
			object_list[object.second.key] = object.first;

		for (auto &object : object_list)
			free(object.second, true);
	}

	data_->objects.clear();
}